

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

Fad<long_double> * __thiscall
TPZMatrix<Fad<long_double>_>::ConditionNumber
          (TPZMatrix<Fad<long_double>_> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *this_00;
  Fad<long_double> *in_RDI;
  Fad<long_double> invnorm;
  Fad<long_double> thisnorm;
  TPZFMatrix<Fad<long_double>_> Inv;
  REAL localtol;
  int64_t localnumiter;
  REAL in_stack_00000230;
  int64_t in_stack_00000238;
  int in_stack_00000244;
  TPZMatrix<Fad<long_double>_> *in_stack_00000248;
  Fad<long_double> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  Fad<long_double> *this_01;
  TPZFMatrix<Fad<long_double>_> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  DecomposeType in_stack_fffffffffffffebc;
  TPZFMatrix<Fad<long_double>_> *in_stack_fffffffffffffec0;
  TPZMatrix<Fad<long_double>_> *in_stack_fffffffffffffec8;
  Fad<long_double> *in_stack_fffffffffffffed0;
  
  this_01 = in_RDI;
  TPZFMatrix<Fad<long_double>_>::TPZFMatrix(in_stack_fffffffffffffeb0);
  MatrixNorm(in_stack_00000248,in_stack_00000244,in_stack_00000238,in_stack_00000230);
  iVar1 = Inverse(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  if (iVar1 == 0) {
    in_stack_fffffffffffffe80 =
         (Fad<long_double> *)
         std::operator<<((ostream *)&std::cerr,
                         "TVar TPZMatrix<Fad<long double>>::ConditionNumber(int, int64_t, REAL) [T = Fad<long double>]"
                        );
    this_00 = std::operator<<((ostream *)in_stack_fffffffffffffe80,
                              " - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Fad<long_double>::Fad<double,_nullptr>
              (this_01,(double *)CONCAT44(iVar1,in_stack_fffffffffffffe88));
  }
  else {
    MatrixNorm(in_stack_00000248,in_stack_00000244,in_stack_00000238,in_stack_00000230);
    operator*<Fad<long_double>,_Fad<long_double>,_nullptr>
              ((Fad<long_double> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (Fad<long_double> *)in_stack_fffffffffffffeb0);
    Fad<long_double>::Fad<FadBinaryMul<Fad<long_double>,Fad<long_double>>>
              (in_stack_fffffffffffffed0,
               (FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
               in_stack_fffffffffffffec8);
    FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)
               in_stack_fffffffffffffe80);
    Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
  }
  Fad<long_double>::~Fad(in_stack_fffffffffffffe80);
  TPZFMatrix<Fad<long_double>_>::~TPZFMatrix((TPZFMatrix<Fad<long_double>_> *)0x1344bc5);
  return in_RDI;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}